

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerEqualityCompare(Lowerer *this,Instr *instr,JnHelperMethod helper)

{
  code *pcVar1;
  Instr *instr_00;
  bool bVar2;
  IRType IVar3;
  IRType IVar4;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar5;
  undefined4 *puVar6;
  bool bVar7;
  bool local_2a;
  bool local_29;
  bool isStrictCompare;
  bool fNoLower;
  Instr *pIStack_28;
  bool needHelper;
  Instr *instrPrev;
  Instr *pIStack_18;
  JnHelperMethod helper_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIStack_28 = instr->m_prev;
  local_29 = true;
  local_2a = false;
  bVar7 = true;
  if (instr->m_opcode != CmSrEq_A) {
    bVar7 = instr->m_opcode == CmSrNeq_A;
  }
  instrPrev._4_4_ = helper;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  pOVar5 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsFloat(pOVar5);
  if (bVar2) {
    pOVar5 = IR::Instr::GetSrc1(pIStack_18);
    IVar3 = IR::Opnd::GetType(pOVar5);
    pOVar5 = IR::Instr::GetSrc2(pIStack_18);
    IVar4 = IR::Opnd::GetType(pOVar5);
    if (IVar3 != IVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x287b,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar7) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    LowererMD::GenerateFastCmXxR8(&this->m_lowererMD,pIStack_18);
  }
  else {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,BranchFastPathPhase,sourceContextId,functionId);
    if ((bVar2) || (bVar2 = Func::DoFastPaths(this->m_func), instr_00 = pIStack_18, !bVar2)) {
      LowerBinaryHelperMem(this,pIStack_18,instrPrev._4_4_);
    }
    else {
      bVar2 = IR::Instr::IsNeq(pIStack_18);
      bVar2 = TryGenerateFastBrOrCmTypeOf(this,instr_00,&stack0xffffffffffffffd8,bVar2,&local_2a);
      if (bVar2) {
        if ((local_2a & 1U) == 0) {
          LowerBinaryHelperMem(this,pIStack_18,instrPrev._4_4_);
        }
      }
      else if ((!bVar7) || (bVar2 = TryGenerateFastCmSrXx(this,pIStack_18), !bVar2)) {
        bVar2 = GenerateFastBrOrCmString(this,pIStack_18);
        if (bVar2) {
          LowerBinaryHelperMem(this,pIStack_18,instrPrev._4_4_);
        }
        else if ((bVar7) &&
                (bVar2 = GenerateFastBrOrCmEqDefinite
                                   (this,pIStack_18,instrPrev._4_4_,&local_29,false,false), bVar2))
        {
          if ((local_29 & 1U) != 0) {
            LowerBinaryHelperMem(this,pIStack_18,instrPrev._4_4_);
          }
        }
        else {
          bVar2 = GenerateFastCmEqLikely(this,pIStack_18,&local_29,false);
          if ((bVar2) || (bVar2 = GenerateFastEqBoolInt(this,pIStack_18,&local_29,false), bVar2)) {
            if ((local_29 & 1U) != 0) {
              if (bVar7) {
                LowerStrictBrOrCm(this,pIStack_18,instrPrev._4_4_,false,false,true);
              }
              else {
                LowerBinaryHelperMem(this,pIStack_18,instrPrev._4_4_);
              }
            }
          }
          else {
            bVar2 = LowererMD::GenerateFastCmXxTaggedInt(&this->m_lowererMD,pIStack_18,false);
            if (!bVar2) {
              if (bVar7) {
                LowerStrictBrOrCm(this,pIStack_18,instrPrev._4_4_,false,false,false);
              }
              else {
                LowerBinaryHelperMem(this,pIStack_18,instrPrev._4_4_);
              }
            }
          }
        }
      }
    }
  }
  if ((local_29 & 1U) == 0) {
    IR::Instr::Remove(pIStack_18);
  }
  return pIStack_28;
}

Assistant:

IR::Instr *
Lowerer::LowerEqualityCompare(IR::Instr* instr, IR::JnHelperMethod helper)
{
    IR::Instr * instrPrev = instr->m_prev;
    bool needHelper = true;
    bool fNoLower = false;
    bool isStrictCompare = instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A;

    if (instr->GetSrc1()->IsFloat())
    {
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        this->m_lowererMD.GenerateFastCmXxR8(instr);
    }
    else if (PHASE_OFF(Js::BranchFastPathPhase, m_func) || !m_func->DoFastPaths())
    {
        LowerBinaryHelperMem(instr, helper);
    }
    else if (TryGenerateFastBrOrCmTypeOf(instr, &instrPrev, instr->IsNeq(), &fNoLower))
    {
        if (!fNoLower)
        {
            LowerBinaryHelperMem(instr, helper);
        }
    }
    else if (isStrictCompare && TryGenerateFastCmSrXx(instr))
    {
    }
    else
    {
        if (GenerateFastBrOrCmString(instr))
        {
            LowerBinaryHelperMem(instr, helper);
        }
        else if (isStrictCompare && GenerateFastBrOrCmEqDefinite(instr, helper, &needHelper, false, false))
        {
            if (needHelper)
            {
                LowerBinaryHelperMem(instr, helper);
            }
        }
        else if(GenerateFastCmEqLikely(instr, &needHelper, false) || GenerateFastEqBoolInt(instr, &needHelper, false))
        {
            if (needHelper)
            {
                if (isStrictCompare)
                {
                    LowerStrictBrOrCm(instr, helper, false, false /* isBranch */, true);
                }
                else
                {
                    LowerBinaryHelperMem(instr, helper);
                }
            }
        }
        else if (!m_lowererMD.GenerateFastCmXxTaggedInt(instr, false))
        {
            if (isStrictCompare)
            {
                LowerStrictBrOrCm(instr, helper, false, false /* isBranch */, false);
            }
            else
            {
                LowerBinaryHelperMem(instr, helper);
            }
        }
    }
    if (!needHelper)
    {
        instr->Remove();
    }
    return instrPrev;
}